

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O3

int V_GetColorFromString(DWORD *palette,char *cstr)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  char cVar8;
  long lVar9;
  char *pcVar10;
  char val [3];
  int c [3];
  char *p;
  char local_47 [3];
  undefined8 local_44;
  uint local_3c;
  char *local_38;
  
  local_47[2] = 0;
  cVar8 = *cstr;
  sVar5 = strlen(cstr);
  if (cVar8 == '#') {
    if (sVar5 == 7) {
      lVar9 = 0;
      do {
        local_47[0] = cstr[lVar9 * 2 + 1];
        local_47[1] = cstr[lVar9 * 2 + 2];
        iVar3 = ParseHex(local_47);
        *(int *)((long)&local_44 + lVar9 * 4) = iVar3;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
    }
    else if (sVar5 == 4) {
      lVar9 = 0;
      do {
        lVar1 = lVar9 + 1;
        local_47[0] = cstr[lVar9 + 1];
        local_47[1] = local_47[0];
        iVar3 = ParseHex(local_47);
        *(int *)((long)&local_44 + lVar9 * 4) = iVar3;
        lVar9 = lVar1;
      } while (lVar1 != 3);
    }
    else {
      local_44 = 0;
      local_3c = 0;
    }
  }
  else if ((sVar5 == 6) && (lVar9 = strtol(cstr,&local_38,0x10), *local_38 == '\0')) {
    local_44 = CONCAT44((int)((ulong)lVar9 >> 8),(int)((ulong)lVar9 >> 0x10)) & 0xff000000ff;
    local_3c = (uint)lVar9 & 0xff;
  }
  else {
    lVar9 = 0;
    do {
      pcVar10 = cstr + -1;
      pcVar6 = cstr;
      do {
        pcVar6 = pcVar6 + 1;
        cVar8 = pcVar10[1];
        cstr = pcVar10 + 1;
        if (' ' < cVar8) break;
        pcVar10 = cstr;
      } while (cVar8 != '\0');
      uVar7 = 0;
      if (' ' < cVar8) {
        uVar7 = 0;
        do {
          if (uVar7 < 2) {
            local_47[uVar7] = cVar8;
          }
          uVar7 = uVar7 + 1;
          cVar8 = *pcVar6;
          pcVar6 = pcVar6 + 1;
        } while (' ' < cVar8);
        cstr = cstr + uVar7;
        if ((int)uVar7 == 1) {
          local_47[1] = local_47[0];
        }
        else if ((int)uVar7 == 0) goto LAB_005ad2ae;
        uVar4 = ParseHex(local_47);
        uVar7 = (ulong)uVar4;
      }
LAB_005ad2ae:
      *(int *)((long)&local_44 + lVar9 * 4) = (int)uVar7;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
  }
  if (palette == (DWORD *)0x0) {
    local_3c = local_44._4_4_ << 8 | (int)local_44 << 0x10 | local_3c;
  }
  else {
    bVar2 = FColorMatcher::Pick(&ColorMatcher,(int)local_44,local_44._4_4_,local_3c);
    local_3c = (uint)bVar2;
  }
  return local_3c;
}

Assistant:

int V_GetColorFromString (const DWORD *palette, const char *cstr)
{
	int c[3], i, p;
	char val[3];

	val[2] = '\0';

	// Check for HTML-style #RRGGBB or #RGB color string
	if (cstr[0] == '#')
	{
		size_t len = strlen (cstr);

		if (len == 7)
		{
			// Extract each eight-bit component into c[].
			for (i = 0; i < 3; ++i)
			{
				val[0] = cstr[1 + i*2];
				val[1] = cstr[2 + i*2];
				c[i] = ParseHex (val);
			}
		}
		else if (len == 4)
		{
			// Extract each four-bit component into c[], expanding to eight bits.
			for (i = 0; i < 3; ++i)
			{
				val[1] = val[0] = cstr[1 + i];
				c[i] = ParseHex (val);
			}
		}
		else
		{
			// Bad HTML-style; pretend it's black.
			c[2] = c[1] = c[0] = 0;
		}
	}
	else
	{
		if (strlen(cstr) == 6)
		{
			char *p;
			int color = strtol(cstr, &p, 16);
			if (*p == 0)
			{
				// RRGGBB string
				c[0] = (color & 0xff0000) >> 16;
				c[1] = (color & 0xff00) >> 8;
				c[2] = (color & 0xff);
			}
			else goto normal;
		}
		else
		{
normal:
			// Treat it as a space-delimited hexadecimal string
			for (i = 0; i < 3; ++i)
			{
				// Skip leading whitespace
				while (*cstr <= ' ' && *cstr != '\0')
				{
					cstr++;
				}
				// Extract a component and convert it to eight-bit
				for (p = 0; *cstr > ' '; ++p, ++cstr)
				{
					if (p < 2)
					{
						val[p] = *cstr;
					}
				}
				if (p == 0)
				{
					c[i] = 0;
				}
				else
				{
					if (p == 1)
					{
						val[1] = val[0];
					}
					c[i] = ParseHex (val);
				}
			}
		}
	}
	if (palette)
		return ColorMatcher.Pick (c[0], c[1], c[2]);
	else
		return MAKERGB(c[0], c[1], c[2]);
}